

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxRestructAreaThree(Gia_Man_t *pNew,Str_Mux_t *pMux,Vec_Int_t *vDelay,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (pMux->Copy == -1) {
    iVar1 = pMux->Id;
    lVar4 = (long)pMux->Edge[1].Fan;
    lVar5 = (long)pMux->Edge[0].Fan;
    pMux->Copy = -2;
    iVar2 = pMux[lVar5 - iVar1].Edge[2].Copy;
    iVar3 = pMux[lVar4 - iVar1].Edge[2].Copy;
    if (iVar2 != iVar3) {
      iVar2 = Gia_ManHashMuxReal(pNew,pMux->Edge[2].Copy,iVar3,iVar2);
      iVar3 = Abc_Lit2Var(iVar2);
      Str_ObjDelay(pNew,iVar3,pMux->nLutSize,vDelay);
      pMux[lVar4 - iVar1].Edge[2].Copy = iVar2;
      pMux[lVar5 - iVar1].Edge[2].Copy = iVar2;
    }
    return 0;
  }
  __assert_fail("pMux->Copy == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                ,0x6ee,"int Str_MuxRestructAreaThree(Gia_Man_t *, Str_Mux_t *, Vec_Int_t *, int)");
}

Assistant:

int Str_MuxRestructAreaThree( Gia_Man_t * pNew, Str_Mux_t * pMux, Vec_Int_t * vDelay, int fVerbose )
{
    int iRes;
    Str_Mux_t * pFanin0 = Str_MuxFanin( pMux, 0 );
    Str_Mux_t * pFanin1 = Str_MuxFanin( pMux, 1 );
    assert( pMux->Copy == -1 );
    pMux->Copy = -2;
    if ( pFanin0->Edge[2].Copy == pFanin1->Edge[2].Copy )
        return 0;
    iRes = Gia_ManHashMuxReal( pNew, pMux->Edge[2].Copy, pFanin1->Edge[2].Copy, pFanin0->Edge[2].Copy );
    Str_ObjDelay( pNew, Abc_Lit2Var(iRes), pMux->nLutSize, vDelay );
    pFanin0->Edge[2].Copy = pFanin1->Edge[2].Copy = iRes;
//    printf( "Created triple\n" );
    return 0;
}